

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  iterator iVar2;
  bool bVar3;
  pair<int,_int> pVar4;
  int i;
  int index;
  uint index_00;
  SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_> *pSVar5;
  AssertionResult gtest_ar__5;
  hasher hasher;
  AssertionResult gtest_ar_;
  TypeParam ht3;
  TypeParam ht1;
  TypeParam ht2;
  undefined1 local_2a8 [8];
  undefined8 local_2a0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_298;
  AssertHelper local_290;
  Hasher local_288;
  pair<google::sparse_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_278;
  undefined1 local_228 [16];
  char local_218 [72];
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_1d0 [2];
  undefined **local_180;
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_178;
  undefined **local_d8;
  int *local_d0 [10];
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_80 [2];
  
  local_228._0_8_ = (pointer)0x0;
  local_228._8_8_ = local_228._8_8_ & 0xffffffff00000000;
  local_278.first.ht =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_278.first.pos.row_begin._M_current =
       local_278.first.pos.row_begin._M_current & 0xffffffff00000000;
  local_d8 = (undefined **)((ulong)local_d8 & 0xffffffff00000000);
  local_d0[0] = (int *)0x0;
  local_180 = &PTR__BaseHashtableInterface_00c26e78;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(&local_178,0,(TransparentHasher *)local_228,(TransparentHasher *)&local_278,
                     (PairNegation<std::pair<int,_int>_> *)local_2a8,
                     (SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_> *)&local_288,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_d8);
  local_180 = &PTR__BaseHashtableInterface_00c26df8;
  local_278.first.ht =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_278.first.pos.row_begin._M_current =
       local_278.first.pos.row_begin._M_current & 0xffffffff00000000;
  local_2a8._0_4_ = 0;
  local_2a8._4_4_ = 0;
  local_2a0 = (undefined8 *)((ulong)local_2a0._4_4_ << 0x20);
  local_228._0_8_ = local_228._0_8_ & 0xffffffff00000000;
  local_228._8_8_ = (int *)0x0;
  local_d8 = &PTR__BaseHashtableInterface_00c26e78;
  pSVar5 = (SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_> *)&local_298;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_d0,0,(TransparentHasher *)&local_278,(TransparentHasher *)local_2a8,
                     (PairNegation<std::pair<int,_int>_> *)&local_288,pSVar5,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_228);
  local_d8 = &PTR__BaseHashtableInterface_00c26df8;
  bVar3 = google::
          sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_178,
                       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_d0);
  local_278.first.ht =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_278.first.ht._1_7_,bVar3);
  local_278.first.pos.row_begin._M_current =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_228,(internal *)&local_278,(AssertionResult *)"ht1 == ht2","false",
               "true",(char *)pSVar5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42e,(char *)local_228._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
    if ((char *)local_228._0_8_ != local_218) {
      operator_delete((void *)local_228._0_8_);
    }
    if ((pair<int,_int>)local_2a8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_2a8 + 8))();
    }
  }
  iVar2._M_current = local_278.first.pos.row_begin._M_current;
  if (local_278.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_278.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_278.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_278.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  bVar3 = google::
          sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_178,
                       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_d0);
  local_278.first.ht =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_278.first.ht._1_7_,bVar3);
  local_278.first.pos.row_begin._M_current =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_228,(internal *)&local_278,(AssertionResult *)"ht1 != ht2","true",
               "false",(char *)pSVar5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42f,(char *)local_228._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
    if ((char *)local_228._0_8_ != local_218) {
      operator_delete((void *)local_228._0_8_);
    }
    if ((pair<int,_int>)local_2a8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_2a8 + 8))();
    }
  }
  iVar2._M_current = local_278.first.pos.row_begin._M_current;
  if (local_278.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_278.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_278.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_278.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  pVar4 = UniqueObjectHelper<std::pair<int,int>>(1);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&local_178);
  local_178.key_info.delkey.first = -pVar4.first;
  local_178.settings.
  super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>.use_deleted_
       = true;
  local_178.key_info.delkey.second = (int)(-((ulong)pVar4 & 0xffffffff00000000) >> 0x20);
  bVar3 = google::
          sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_178,
                       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_d0);
  local_278.first.ht =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_278.first.ht._1_7_,bVar3);
  local_278.first.pos.row_begin._M_current =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_228,(internal *)&local_278,(AssertionResult *)"ht1 == ht2","false",
               "true",(char *)pSVar5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x432,(char *)local_228._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
    if ((char *)local_228._0_8_ != local_218) {
      operator_delete((void *)local_228._0_8_);
    }
    if ((pair<int,_int>)local_2a8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_2a8 + 8))();
    }
  }
  iVar2._M_current = local_278.first.pos.row_begin._M_current;
  if (local_278.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_278.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_278.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_278.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  bVar3 = google::
          sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_178,
                       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_d0);
  local_278.first.ht =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_278.first.ht._1_7_,bVar3);
  local_278.first.pos.row_begin._M_current =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_228,(internal *)&local_278,(AssertionResult *)"ht1 != ht2","true",
               "false",(char *)pSVar5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x433,(char *)local_228._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
    if ((char *)local_228._0_8_ != local_218) {
      operator_delete((void *)local_228._0_8_);
    }
    if ((pair<int,_int>)local_2a8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_2a8 + 8))();
    }
  }
  iVar2._M_current = local_278.first.pos.row_begin._M_current;
  if (local_278.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_278.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_278.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_278.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize(&local_178,2000);
  bVar3 = google::
          sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_178,
                       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_d0);
  local_278.first.ht =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_278.first.ht._1_7_,bVar3);
  local_278.first.pos.row_begin._M_current =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_228,(internal *)&local_278,(AssertionResult *)"ht1 == ht2","false",
               "true",(char *)pSVar5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x435,(char *)local_228._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
    if ((char *)local_228._0_8_ != local_218) {
      operator_delete((void *)local_228._0_8_);
    }
    if ((pair<int,_int>)local_2a8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_2a8 + 8))();
    }
  }
  iVar2._M_current = local_278.first.pos.row_begin._M_current;
  if (local_278.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_278.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_278.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_278.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  local_288.id_ = 1;
  local_288.num_hashes_ = 0;
  local_288.num_compares_ = 0;
  local_278.first.ht =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_278.first.ht._4_4_,2);
  local_278.first.pos.row_begin._M_current =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  this_00 = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(local_228 + 8);
  local_228._0_8_ = &PTR__BaseHashtableInterface_00c26e78;
  pSVar5 = (SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_> *)&local_298;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(this_00,5,(TransparentHasher *)&local_288,(TransparentHasher *)&local_288,
                     (PairNegation<std::pair<int,_int>_> *)local_2a8,pSVar5,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_278);
  local_228._0_8_ = &PTR__BaseHashtableInterface_00c26df8;
  bVar3 = google::
          sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_178,this_00);
  local_2a8[0] = bVar3;
  local_2a0 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_278,(internal *)local_2a8,(AssertionResult *)"ht1 == ht3","false",
               "true",(char *)pSVar5);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43b,(char *)local_278.first.ht);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_278.first.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_278.first.pos + 8U)) {
      operator_delete(local_278.first.ht);
    }
    if (local_298._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_298._M_head_impl + 8))();
    }
  }
  puVar1 = local_2a0;
  if (local_2a0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2a0 != local_2a0 + 2) {
      operator_delete((undefined8 *)*local_2a0);
    }
    operator_delete(puVar1);
  }
  bVar3 = google::
          sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_178,this_00);
  local_2a8[0] = bVar3;
  local_2a0 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_278,(internal *)local_2a8,(AssertionResult *)"ht1 != ht3","true",
               "false",(char *)pSVar5);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43c,(char *)local_278.first.ht);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_278.first.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_278.first.pos + 8U)) {
      operator_delete(local_278.first.ht);
    }
    if (local_298._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_298._M_head_impl + 8))();
    }
  }
  puVar1 = local_2a0;
  if (local_2a0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2a0 != local_2a0 + 2) {
      operator_delete((undefined8 *)*local_2a0);
    }
    operator_delete(puVar1);
  }
  local_2a8 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(2);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_178,1);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize(&local_278,&local_178,(const_reference)local_2a8);
  bVar3 = google::
          sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_178,
                       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_d0);
  local_2a8[0] = !bVar3;
  local_2a0 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_278,(internal *)local_2a8,(AssertionResult *)"ht1 != ht2","false",
               "true",(char *)pSVar5);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43f,(char *)local_278.first.ht);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_278.first.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_278.first.pos + 8U)) {
      operator_delete(local_278.first.ht);
    }
    if (local_298._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_298._M_head_impl + 8))();
    }
  }
  puVar1 = local_2a0;
  if (local_2a0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2a0 != local_2a0 + 2) {
      operator_delete((undefined8 *)*local_2a0);
    }
    operator_delete(puVar1);
  }
  bVar3 = google::
          sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_178,
                       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_d0);
  local_2a8[0] = !bVar3;
  local_2a0 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_278,(internal *)local_2a8,(AssertionResult *)"ht1 == ht2","true",
               "false",(char *)pSVar5);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x440,(char *)local_278.first.ht);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_278.first.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_278.first.pos + 8U)) {
      operator_delete(local_278.first.ht);
    }
    if (local_298._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_298._M_head_impl + 8))();
    }
  }
  puVar1 = local_2a0;
  if (local_2a0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2a0 != local_2a0 + 2) {
      operator_delete((undefined8 *)*local_2a0);
    }
    operator_delete(puVar1);
  }
  local_2a8 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(2);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_d0,1);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize(&local_278,
                    (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     *)local_d0,(const_reference)local_2a8);
  bVar3 = google::
          sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_178,
                       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_d0);
  local_2a8[0] = bVar3;
  local_2a0 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_278,(internal *)local_2a8,(AssertionResult *)"ht1 == ht2","false",
               "true",(char *)pSVar5);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x443,(char *)local_278.first.ht);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_278.first.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_278.first.pos + 8U)) {
      operator_delete(local_278.first.ht);
    }
    if (local_298._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_298._M_head_impl + 8))();
    }
  }
  puVar1 = local_2a0;
  if (local_2a0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2a0 != local_2a0 + 2) {
      operator_delete((undefined8 *)*local_2a0);
    }
    operator_delete(puVar1);
  }
  index = 3;
  do {
    local_2a8 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(index);
    google::
    sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&local_178,1);
    google::
    sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize(&local_278,&local_178,(const_reference)local_2a8);
    index = index + 1;
  } while (index != 0x7d1);
  index_00 = 0x7d1;
  do {
    index_00 = index_00 - 1;
    local_2a8 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(index_00);
    google::
    sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta((sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_d0,1);
    google::
    sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize(&local_278,
                      (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)local_d0,(const_reference)local_2a8);
  } while (3 < index_00);
  bVar3 = google::
          sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&local_178,
                       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)local_d0);
  local_2a8[0] = bVar3;
  local_2a0 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_278,(internal *)local_2a8,(AssertionResult *)"ht1 == ht2","false",
               "true",(char *)pSVar5);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,1099,(char *)local_278.first.ht);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_278.first.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_278.first.pos + 8U)) {
      operator_delete(local_278.first.ht);
    }
    if (local_298._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_298._M_head_impl + 8))();
    }
  }
  puVar1 = local_2a0;
  if (local_2a0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2a0 != local_2a0 + 2) {
      operator_delete((undefined8 *)*local_2a0);
    }
    operator_delete(puVar1);
  }
  local_228._0_8_ = &PTR__BaseHashtableInterface_00c26e78;
  std::
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(local_1d0);
  local_d8 = &PTR__BaseHashtableInterface_00c26e78;
  std::
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(local_80);
  local_180 = &PTR__BaseHashtableInterface_00c26e78;
  std::
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_178.table.groups);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}